

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

PackageImportItemSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  PackageImportItemSyntax *pPVar1;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index * 2);
  this_01 = TokenOrSyntax::node(this_00);
  pPVar1 = SyntaxNode::as<slang::syntax::PackageImportItemSyntax>(this_01);
  return pPVar1;
}

Assistant:

const T* operator[](size_t index) const {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }